

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::composite
          (QOpenGL2PaintEngineExPrivate *this,QOpenGLRect *boundingRect)

{
  QOpenGLRect *in_RSI;
  long in_RDI;
  GLfloat *unaff_retaddr;
  long lVar1;
  
  lVar1 = in_RDI;
  setCoords((GLfloat *)(in_RDI + 0x380),in_RSI);
  uploadData(this,boundingRect._4_4_,unaff_retaddr,(GLuint)((ulong)lVar1 >> 0x20));
  QOpenGLFunctions::glDrawArrays
            ((QOpenGLFunctions *)in_RSI,(GLenum)((ulong)in_RDI >> 0x20),(GLint)in_RDI,0);
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::composite(const QOpenGLRect& boundingRect)
{
    setCoords(staticVertexCoordinateArray, boundingRect);

    uploadData(QT_VERTEX_COORDS_ATTR, staticVertexCoordinateArray, 8);
    funcs.glDrawArrays(GL_TRIANGLE_FAN, 0, 4);
}